

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

Time __thiscall helics::Federate::requestTimeComplete(Federate *this)

{
  bool bVar1;
  TimeRepresentation<count_time<9,_long>_> newTime;
  InvalidFunctionCall *this_00;
  string_view message;
  Modes exp;
  handle asyncInfo;
  
  exp = PENDING_TIME;
  bVar1 = std::atomic<helics::Federate::Modes>::compare_exchange_strong
                    (&this->currentMode,&exp,EXECUTING,seq_cst);
  if (bVar1) {
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
              (&asyncInfo,
               (this->asyncCallInfo)._M_t.
               super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               .
               super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
               ._M_head_impl);
    newTime = std::future<TimeRepresentation<count_time<9,_long>_>_>::get
                        (&(asyncInfo.data)->timeRequestFuture);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::unlock(&asyncInfo);
    postTimeRequestOperations(this,(Time)newTime.internalTimeCode,false);
    std::unique_lock<std::mutex>::~unique_lock(&asyncInfo.m_handle_lock);
    return (Time)newTime.internalTimeCode;
  }
  this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
  message._M_str = "cannot call requestTimeComplete without first calling requestTimeAsync function"
  ;
  message._M_len = 0x4f;
  InvalidFunctionCall::InvalidFunctionCall(this_00,message);
  __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
}

Assistant:

Time Federate::requestTimeComplete()
{
    auto exp = Modes::PENDING_TIME;
    if (currentMode.compare_exchange_strong(exp, Modes::EXECUTING)) {
        auto asyncInfo = asyncCallInfo->lock();
        auto newTime = asyncInfo->timeRequestFuture.get();
        asyncInfo.unlock();  // remove the lock;
        postTimeRequestOperations(newTime, false);
        return newTime;
    }
    throw(InvalidFunctionCall(
        "cannot call requestTimeComplete without first calling requestTimeAsync function"));
}